

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_ostream.hpp
# Opt level: O3

ostream * __thiscall
boost::unit_test::
lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>,_char[6],_const_char_(&)[6]>,_char[8],_const_char_(&)[8]>
::operator()(lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>,_char[6],_const_char_(&)[6]>,_char[8],_const_char_(&)[8]>
             *this,ostream *ostr)

{
  char (*__s) [8];
  int iVar1;
  undefined4 extraout_var;
  size_t sVar3;
  ostream *poVar2;
  
  iVar1 = (*(this->m_prev->super_lazy_ostream)._vptr_lazy_ostream[2])();
  poVar2 = (ostream *)CONCAT44(extraout_var,iVar1);
  __s = this->m_value;
  if (__s == (char (*) [8])0x0) {
    std::ios::clear(iVar1 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(*__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,*__s,sVar3);
  }
  return poVar2;
}

Assistant:

virtual std::ostream&   operator()( std::ostream& ostr ) const
    {
        return m_prev(ostr) << m_value;
    }